

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O2

void __thiscall duckdb::BaseStatistics::SetHasNoNull(BaseStatistics *this)

{
  idx_t iVar1;
  BaseStatistics *this_00;
  idx_t c;
  ulong i;
  
  this->has_no_null = true;
  if ((this->type).physical_type_ == STRUCT) {
    for (i = 0; iVar1 = StructType::GetChildCount(&this->type), i < iVar1; i = i + 1) {
      this_00 = StructStats::GetChildStats(this,i);
      SetHasNoNull(this_00);
    }
  }
  return;
}

Assistant:

void BaseStatistics::SetHasNoNull() {
	has_no_null = true;
	if (type.InternalType() == PhysicalType::STRUCT) {
		for (idx_t c = 0; c < StructType::GetChildCount(type); c++) {
			StructStats::GetChildStats(*this, c).SetHasNoNull();
		}
	}
}